

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

void cpu_wrdsp_mips64el(uint32_t rs,uint32_t mask_num,CPUMIPSState_conflict5 *env)

{
  target_ulong tVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [12];
  unkbyte10 Var5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  uint uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  byte bVar13;
  char cVar30;
  char cVar31;
  char cVar32;
  undefined1 auVar18 [16];
  undefined1 auVar25 [16];
  undefined1 auVar29 [16];
  uint8_t mask [6];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar26 [16];
  undefined1 auVar14 [11];
  undefined1 auVar20 [16];
  undefined1 auVar27 [16];
  undefined1 auVar15 [12];
  undefined1 auVar21 [16];
  undefined1 auVar16 [13];
  undefined1 auVar22 [16];
  undefined1 auVar28 [16];
  undefined1 auVar24 [16];
  undefined1 auVar23 [16];
  undefined2 uVar33;
  
  tVar1 = (env->active_tc).DSPControl;
  for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
    mask[lVar11] = (mask_num >> ((uint)lVar11 & 0x1f) & 1) != 0;
  }
  auVar12._4_4_ = rs;
  auVar12._0_4_ = rs;
  auVar12._8_4_ = rs;
  auVar12._12_4_ = rs;
  bVar13 = -((uint8_t)mask._0_4_ == '\x01');
  cVar30 = -(SUB41(mask._0_4_,1) == '\x01');
  auVar18._0_2_ = CONCAT11(cVar30,bVar13);
  cVar31 = -(SUB41(mask._0_4_,2) == '\x01');
  auVar19._0_3_ = CONCAT12(cVar31,auVar18._0_2_);
  cVar32 = -(SUB41(mask._0_4_,3) == '\x01');
  auVar14._0_10_ = (unkuint10)0xffffff << 0x38;
  auVar14[10] = 0xff;
  auVar15[0xb] = 0xff;
  auVar15._0_11_ = auVar14;
  auVar16[0xc] = 0xff;
  auVar16._0_12_ = auVar15;
  auVar24[0xd] = 0xff;
  auVar24._0_13_ = auVar16;
  auVar24[0xe] = 0xff;
  auVar24[0xf] = 0xff;
  auVar23._14_2_ = auVar24._14_2_;
  auVar23[0xd] = 0xff;
  auVar23._0_13_ = auVar16;
  auVar22._13_3_ = auVar23._13_3_;
  auVar22[0xc] = 0xff;
  auVar22._0_12_ = auVar15;
  auVar21._12_4_ = auVar22._12_4_;
  auVar21[0xb] = 0xff;
  auVar21._0_11_ = auVar14;
  auVar20._11_5_ = auVar21._11_5_;
  auVar20[10] = 0xff;
  auVar20._0_10_ = auVar14._0_10_;
  Var5 = CONCAT91(CONCAT81((long)(CONCAT72((int7)(CONCAT63(auVar20._10_6_,0xffffff) >> 0x10),0xffff)
                                 >> 8),cVar32),cVar32);
  auVar4._2_10_ = Var5;
  auVar4[1] = cVar31;
  auVar4[0] = cVar31;
  auVar19[3] = cVar30;
  auVar19._4_12_ = auVar4;
  auVar18._3_13_ = auVar19._3_13_;
  auVar18[2] = cVar30;
  auVar17._2_14_ = auVar18._2_14_;
  auVar17._0_2_ = CONCAT11(bVar13,bVar13);
  uVar33 = (undefined2)Var5;
  auVar28._0_12_ = auVar17._0_12_;
  auVar28._12_2_ = uVar33;
  auVar28._14_2_ = uVar33;
  auVar27._12_4_ = auVar28._12_4_;
  auVar27._0_10_ = auVar17._0_10_;
  auVar27._10_2_ = auVar4._0_2_;
  auVar26._10_6_ = auVar27._10_6_;
  auVar26._0_8_ = auVar17._0_8_;
  auVar26._8_2_ = auVar4._0_2_;
  auVar6._4_8_ = auVar26._8_8_;
  auVar6._2_2_ = auVar18._2_2_;
  auVar6._0_2_ = auVar18._2_2_;
  auVar25._2_2_ = auVar17._0_2_;
  auVar25._0_2_ = auVar17._0_2_;
  auVar25._4_12_ = auVar6;
  uVar9 = (auVar19._0_3_ & 1) - 1 | 0xffffff80;
  auVar12 = auVar12 & auVar25 & _DAT_00ba0090;
  auVar7._12_4_ = 0;
  auVar7._0_12_ = auVar6;
  uVar2 = uVar9 & 0xffffe07f;
  if ((auVar7 << 0x20 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
    uVar2 = uVar9;
  }
  uVar9 = uVar2 & 0xffffdfff;
  if ((bVar13 & 1) == 0) {
    uVar9 = uVar2;
  }
  auVar8._12_4_ = 0;
  auVar8._0_12_ = auVar6;
  uVar2 = uVar9 & 0xff00ffff;
  if ((auVar8 << 0x20 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
    uVar2 = uVar9;
  }
  uVar9 = rs & 0xff000000;
  if (mask[4] != '\x01') {
    uVar9 = 0;
  }
  auVar29._0_8_ = auVar12._8_8_;
  auVar29._8_4_ = auVar12._8_4_;
  auVar29._12_4_ = auVar12._12_4_;
  uVar10 = uVar2 & 0xffffff;
  if (mask[4] != '\x01') {
    uVar10 = uVar2;
  }
  uVar2 = uVar10 & 0xffffbfff;
  uVar3 = rs & 0x4000;
  if (mask[5] != '\x01') {
    uVar2 = uVar10;
    uVar3 = 0;
  }
  (env->active_tc).DSPControl =
       (ulong)((uint)tVar1 & uVar2 |
              uVar3 | uVar9 | SUB164(auVar29 | auVar12,4) | SUB164(auVar29 | auVar12,0));
  return;
}

Assistant:

void cpu_wrdsp(uint32_t rs, uint32_t mask_num, CPUMIPSState *env)
{
    uint8_t  mask[6];
    uint8_t  i;
    uint32_t newbits, overwrite;
    target_ulong dsp;

    newbits   = 0x00;
    overwrite = 0xFFFFFFFF;
    dsp = env->active_tc.DSPControl;

    for (i = 0; i < 6; i++) {
        mask[i] = (mask_num >> i) & 0x01;
    }

    if (mask[0] == 1) {
#if defined(TARGET_MIPS64)
        overwrite &= 0xFFFFFF80;
        newbits   &= 0xFFFFFF80;
        newbits   |= 0x0000007F & rs;
#else
        overwrite &= 0xFFFFFFC0;
        newbits   &= 0xFFFFFFC0;
        newbits   |= 0x0000003F & rs;
#endif
    }

    if (mask[1] == 1) {
        overwrite &= 0xFFFFE07F;
        newbits   &= 0xFFFFE07F;
        newbits   |= 0x00001F80 & rs;
    }

    if (mask[2] == 1) {
        overwrite &= 0xFFFFDFFF;
        newbits   &= 0xFFFFDFFF;
        newbits   |= 0x00002000 & rs;
    }

    if (mask[3] == 1) {
        overwrite &= 0xFF00FFFF;
        newbits   &= 0xFF00FFFF;
        newbits   |= 0x00FF0000 & rs;
    }

    if (mask[4] == 1) {
        overwrite &= 0x00FFFFFF;
        newbits   &= 0x00FFFFFF;
#if defined(TARGET_MIPS64)
        newbits   |= 0xFF000000 & rs;
#else
        newbits   |= 0x0F000000 & rs;
#endif
    }

    if (mask[5] == 1) {
        overwrite &= 0xFFFFBFFF;
        newbits   &= 0xFFFFBFFF;
        newbits   |= 0x00004000 & rs;
    }

    dsp = dsp & overwrite;
    dsp = dsp | newbits;
    env->active_tc.DSPControl = dsp;
}